

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O1

bool __thiscall
CMU462::StaticScene::BVHAccel::find_closest_hit
          (BVHAccel *this,Ray *ray,BVHNode *node,Intersection *isect)

{
  BVHNode **ppBVar1;
  Primitive *pPVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  BVHNode *pBVar7;
  byte bVar8;
  BVHNode **ppBVar9;
  size_t sVar10;
  BVHNode **ppBVar11;
  double t0_r;
  double t0_l;
  double t1_r;
  double t1_l;
  double local_78;
  double local_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_40;
  double local_38;
  
  pBVar7 = node->l;
  if (node->r == (BVHNode *)0x0 && pBVar7 == (BVHNode *)0x0) {
    sVar10 = node->start;
    uVar6 = node->range + sVar10;
    bVar8 = 0;
    for (; sVar10 < uVar6; sVar10 = sVar10 + 1) {
      pPVar2 = (this->super_Aggregate).primitives.
               super__Vector_base<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
               ._M_impl.super__Vector_impl_data._M_start[sVar10];
      iVar5 = (*pPVar2->_vptr_Primitive[2])(pPVar2,ray,isect);
      bVar8 = bVar8 | (byte)iVar5;
      uVar6 = node->range + node->start;
    }
  }
  else {
    ppBVar1 = &node->r;
    if (pBVar7 == (BVHNode *)0x0) {
      bVar3 = false;
    }
    else {
      bVar3 = BBox::intersect(&pBVar7->bb,ray,&local_70,&local_38);
    }
    if (*ppBVar1 == (BVHNode *)0x0) {
      bVar4 = false;
    }
    else {
      bVar4 = BBox::intersect(&(*ppBVar1)->bb,ray,&local_78,&local_40);
    }
    if ((bVar3 | bVar4) == 1) {
      if (bVar4 == true && bVar3 == false) {
        pBVar7 = *ppBVar1;
      }
      else {
        ppBVar9 = &node->l;
        if (bVar4 != false || bVar3 != true) {
          local_58 = local_70;
          uStack_50 = 0;
          local_68 = local_78;
          uStack_60 = 0;
          ppBVar11 = ppBVar1;
          if (local_78 < local_70) {
            ppBVar11 = ppBVar9;
            ppBVar9 = ppBVar1;
          }
          pBVar7 = *ppBVar11;
          bVar8 = find_closest_hit(this,ray,*ppBVar9,isect);
          if ((!(bool)bVar8) ||
             ((double)(~-(ulong)(local_68 < local_58) & (ulong)local_68 |
                      (ulong)local_58 & -(ulong)(local_68 < local_58)) < isect->t)) {
            bVar3 = find_closest_hit(this,ray,pBVar7,isect);
            bVar8 = (bool)bVar8 || bVar3;
          }
          goto LAB_00188d5a;
        }
        pBVar7 = *ppBVar9;
      }
      bVar8 = find_closest_hit(this,ray,pBVar7,isect);
    }
    else {
      bVar8 = 0;
    }
  }
LAB_00188d5a:
  return (bool)(bVar8 & 1);
}

Assistant:

bool BVHAccel::find_closest_hit(const Ray &ray, BVHNode* node, Intersection *isect) const {
	if (node->isLeaf()) {
		bool hit = false;
		for (size_t p = node->start; p < node->start + node->range; ++p) {
			hit = hit | primitives[p]->intersect(ray, isect);
		}
		return hit;
	}
	else {
		bool hit_l, hit_r;
		double t0_l, t1_l, t0_r, t1_r;
		if (node->l == NULL) hit_l = false;
		else hit_l = node->l->bb.intersect(ray, t0_l, t1_l);
		if (node->r == NULL) hit_r = false;
		else hit_r = node->r->bb.intersect(ray, t0_r, t1_r);
		
		if (!hit_l && !hit_r) return false;
		else if (!hit_l && hit_r) {
			return find_closest_hit(ray, node->r, isect);
		}
		else if (!hit_r && hit_l) {
			return find_closest_hit(ray, node->l, isect);
		}
		else {
			BVHNode* first, *second;
			double second_t;
			bool true_hit;
			if (t0_l <= t0_r) {
				first = node->l;
				second = node->r;
				second_t = t0_r;
			}
			else {
				first = node->r;
				second = node->l;
				second_t = t0_l;
			}

			true_hit = find_closest_hit(ray, first, isect);
			if (!true_hit || isect->t > second_t) {
				true_hit = true_hit | find_closest_hit(ray, second, isect);
			}
			return true_hit;
		}
	}
}